

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

string * __thiscall
Ratio::toStringVerbose
          (string *__return_storage_ptr__,Ratio *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *leaf2NumMap)

{
  pointer pPVar1;
  ostream *poVar2;
  ulong uVar3;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *pdVar4;
  long lVar5;
  string local_2a8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_250;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  ostringstream ss;
  undefined8 local_1a0 [2];
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  *(uint *)((long)auStack_190 + *(long *)(_ss + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_ss + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_1a0 + *(long *)(_ss + -0x18)) = 8;
  poVar2 = std::ostream::_M_insert<double>(this->eLength / this->fLength);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&ss,"Total length and corresponding edges dropped:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(this->eLength);
  std::operator<<(poVar2,"\t");
  lVar5 = 0;
  uVar3 = 0;
  while( true ) {
    pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->eEdges).
                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pPVar1) / 0x48) <= uVar3) break;
    if (lVar5 == 0) {
      Bipartition::getPartition(&local_1f8,&pPVar1->super_Bipartition);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_210,leaf2NumMap);
      Bipartition::toStringVerbose(&local_2a8,&local_1f8,&local_210);
      poVar2 = std::operator<<((ostream *)&ss,(string *)&local_2a8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_210);
      pdVar4 = &local_1f8;
    }
    else {
      poVar2 = std::operator<<((ostream *)&ss,"\t\t");
      Bipartition::getPartition
                (&local_230,
                 (Bipartition *)
                 ((long)&(((this->eEdges).
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_start)->super_Bipartition)._vptr_Bipartition
                 + lVar5));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1c0,leaf2NumMap);
      Bipartition::toStringVerbose(&local_2a8,&local_230,&local_1c0);
      poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c0);
      pdVar4 = &local_230;
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(pdVar4);
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x48;
  }
  poVar2 = std::operator<<((ostream *)&ss,"\nTotal length and corresponding edges added:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(this->fLength);
  std::operator<<(poVar2,"\t");
  lVar5 = 0;
  uVar3 = 0;
  while( true ) {
    pPVar1 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->fEdges).
                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pPVar1) / 0x48) <= uVar3) break;
    if (lVar5 == 0) {
      Bipartition::getPartition(&local_250,&pPVar1->super_Bipartition);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_268,leaf2NumMap);
      Bipartition::toStringVerbose(&local_2a8,&local_250,&local_268);
      poVar2 = std::operator<<((ostream *)&ss,(string *)&local_2a8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268);
      pdVar4 = &local_250;
    }
    else {
      poVar2 = std::operator<<((ostream *)&ss,"\t\t");
      Bipartition::getPartition
                (&local_288,
                 (Bipartition *)
                 ((long)&(((this->fEdges).
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_start)->super_Bipartition)._vptr_Bipartition
                 + lVar5));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1d8,leaf2NumMap);
      Bipartition::toStringVerbose(&local_2a8,&local_288,&local_1d8);
      poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8);
      pdVar4 = &local_288;
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(pdVar4);
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x48;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string Ratio::toStringVerbose(const vector<string>& leaf2NumMap) {
    std::ostringstream ss;
    ss << std::fixed << std::setprecision(8);

    ss << getRatio() << endl;

    ss << "Total length and corresponding edges dropped:" << endl;

    ss << eLength << "\t";

    // list the edges dropped
    for (int i = 0; i < eEdges.size(); i++) {
        if (i == 0) {   // nice formatting
            ss << Bipartition::toStringVerbose(eEdges[i].getPartition(), leaf2NumMap) << endl;
        } else {
            ss << "\t\t" << Bipartition::toStringVerbose(eEdges[i].getPartition(), leaf2NumMap) << endl;
        }
    }

    ss << "\nTotal length and corresponding edges added:" << endl;

    ss << fLength << "\t";

    // list the edges added
    for (int i = 0; i < fEdges.size(); i++) {
        if (i == 0) {   // nice formatting
            ss << Bipartition::toStringVerbose(fEdges[i].getPartition(), leaf2NumMap) << endl;
        } else {
            ss << "\t\t" << Bipartition::toStringVerbose(fEdges[i].getPartition(), leaf2NumMap) << endl;
        }
    }

    return ss.str();

}